

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O3

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isRecognized(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int index)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var2 = (this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var5 = &(this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var5->_M_header;
    do {
      if (index <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < index];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var5) && (bVar6 = true, (int)p_Var3[1]._M_color <= index))
    goto LAB_00307724;
  }
  p_Var2 = (this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var5->_M_header;
  p_Var4 = &p_Var5->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (index <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < index];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var5) && (p_Var4 = p_Var3, index < (int)p_Var3[1]._M_color))
    {
      p_Var4 = &p_Var5->_M_header;
    }
  }
  bVar6 = (_Rb_tree_header *)p_Var4 != p_Var5;
LAB_00307724:
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return bVar6;
}

Assistant:

bool isRecognized(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByInteger.find(index);
        if (fnd != promiseByInteger.end()) {
            return true;
        }
        auto fnd2 = usedPromiseByInteger.find(index);
        if (fnd2 != usedPromiseByInteger.end()) {
            return true;
        }
        return false;
    }